

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__context *s_00;
  FILE *in_RDI;
  long pos;
  stbi__context s;
  int r;
  FILE *in_stack_fffffffffffffee8;
  stbi__context *in_stack_fffffffffffffef8;
  
  s_00 = (stbi__context *)ftell(in_RDI);
  stbi__start_file(s_00,in_stack_fffffffffffffee8);
  iVar1 = stbi__info_main(in_stack_fffffffffffffef8,(int *)s_00,(int *)in_stack_fffffffffffffee8,
                          (int *)0x7a813d);
  fseek(in_RDI,(long)s_00,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}